

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall
spv::Builder::addInstructionNoDebugInfo
          (Builder *this,unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *inst)

{
  Block *this_00;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_20;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *local_18;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *inst_local;
  Builder *this_local;
  
  this_00 = this->buildPoint;
  local_18 = inst;
  inst_local = (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)this;
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
            (&local_20,inst);
  Block::addInstruction(this_00,&local_20);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_20);
  return;
}

Assistant:

void Builder::addInstructionNoDebugInfo(std::unique_ptr<Instruction> inst) {
    buildPoint->addInstruction(std::move(inst));
}